

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_manual_wal_flush(void)

{
  fdb_encryption_key *pfVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_file_handle **ptr_fhandle;
  btree *ptr_fhandle_00;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  ulong uVar9;
  fdb_kvs_handle **ppfVar10;
  fdb_iterator **ptr_iterator_01;
  fdb_config *pfVar11;
  uint uVar12;
  fdb_doc **doc;
  char *pcVar13;
  fdb_doc *doc_00;
  long lVar14;
  fdb_kvs_handle *pfVar15;
  fdb_config *pfVar16;
  char *doc_01;
  fdb_iterator *it;
  fdb_kvs_handle *db2;
  uchar start_key2 [11];
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  uchar start_key1 [11];
  uchar key1 [15];
  uchar key2 [17];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *pfStack_3938;
  fdb_kvs_handle *pfStack_3930;
  fdb_file_handle *pfStack_3928;
  fdb_doc *pfStack_3920;
  fdb_kvs_config fStack_3918;
  timeval tStack_3900;
  fdb_config fStack_38f0;
  fdb_config *pfStack_37f8;
  fdb_iterator *pfStack_37e0;
  fdb_kvs_handle *pfStack_37d8;
  fdb_doc *pfStack_37d0;
  fdb_file_handle *pfStack_37c8;
  fdb_kvs_config fStack_37c0;
  timeval tStack_37a8;
  fdb_config fStack_3798;
  fdb_config *pfStack_36a0;
  fdb_iterator *pfStack_3688;
  fdb_kvs_handle *pfStack_3680;
  fdb_file_handle *pfStack_3678;
  fdb_doc *pfStack_3670;
  uint64_t uStack_3668;
  undefined1 uStack_3660;
  undefined7 uStack_3658;
  undefined4 uStack_3651;
  undefined8 uStack_3648;
  undefined7 uStack_3640;
  undefined4 uStack_3639;
  fdb_kvs_config fStack_3630;
  timeval tStack_3618;
  undefined4 uStack_3608;
  undefined1 uStack_3604;
  fdb_config fStack_3500;
  char acStack_3408 [256];
  fdb_config *pfStack_3308;
  char *pcStack_3300;
  code *pcStack_32f8;
  fdb_doc *pfStack_32e0;
  fdb_iterator *pfStack_32d8;
  fdb_kvs_handle *pfStack_32d0;
  fdb_file_handle *pfStack_32c8;
  fdb_kvs_config fStack_32c0;
  timeval tStack_32a8;
  fdb_config fStack_3298;
  fdb_iterator **ppfStack_31a0;
  fdb_iterator *pfStack_3188;
  fdb_doc *pfStack_3180;
  fdb_kvs_handle *pfStack_3178;
  fdb_file_handle *pfStack_3170;
  timeval tStack_3168;
  fdb_iterator *apfStack_3158 [33];
  fdb_kvs_config fStack_3050;
  char acStack_3038 [264];
  fdb_config fStack_2f30;
  char acStack_2e38 [256];
  fdb_kvs_handle *pfStack_2d38;
  fdb_kvs_handle *pfStack_2d30;
  fdb_doc **ppfStack_2d28;
  fdb_doc **ppfStack_2d20;
  fdb_doc **ppfStack_2d18;
  fdb_kvs_handle *pfStack_2d08;
  fdb_file_handle *pfStack_2d00;
  fdb_iterator *pfStack_2cf8;
  fdb_doc *pfStack_2cf0;
  fdb_kvs_handle *pfStack_2ce8;
  fdb_doc *pfStack_2ce0;
  fdb_kvs_config fStack_2cd8;
  timeval tStack_2cc0;
  fdb_doc *apfStack_2cb0 [32];
  undefined1 auStack_2bb0 [272];
  uint8_t auStack_2aa0 [20];
  undefined4 uStack_2a8c;
  undefined4 uStack_2a84;
  undefined1 uStack_2a7a;
  fdb_doc *apfStack_29b0 [500];
  fdb_kvs_handle afStack_1a10 [7];
  fdb_kvs_handle **ppfStack_a68;
  fdb_kvs_handle *pfStack_a60;
  fdb_doc **ppfStack_a50;
  fdb_doc **ppfStack_a48;
  fdb_doc **ppfStack_a40;
  fdb_kvs_handle *pfStack_a30;
  fdb_iterator *pfStack_a28;
  fdb_iterator *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_file_handle *pfStack_a10;
  fdb_doc *pfStack_a08;
  fdb_file_handle *pfStack_a00;
  undefined1 auStack_9f8 [56];
  fdb_config fStack_9c0;
  fdb_doc *apfStack_8c8 [65];
  fdb_config **ppfStack_6c0;
  btree *pbStack_6b8;
  fdb_kvs_handle **ppfStack_6b0;
  fdb_config *pfStack_6a8;
  fdb_file_handle **ppfStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_config *pfStack_688;
  fdb_config *pfStack_680;
  fdb_kvs_handle *pfStack_678;
  fdb_file_handle *pfStack_670;
  fdb_kvs_config fStack_668;
  fdb_doc *apfStack_650 [5];
  fdb_kvs_handle *apfStack_628 [5];
  timeval tStack_600;
  fdb_kvs_handle fStack_5f0;
  fdb_config fStack_2f0;
  fdb_kvs_handle **ppfStack_1f8;
  btree *pbStack_1f0;
  fdb_kvs_handle **ppfStack_1e8;
  undefined8 *puStack_1e0;
  undefined7 *puStack_1d8;
  fdb_kvs_handle *pfStack_1d0;
  fdb_kvs_handle *local_1c0;
  fdb_kvs_handle *local_1b8;
  fdb_kvs_handle *local_1b0;
  undefined7 local_1a8;
  undefined4 uStack_1a1;
  fdb_kvs_handle *local_198;
  fdb_file_handle *local_190;
  undefined1 local_188 [16];
  undefined7 local_178;
  undefined1 uStack_171;
  undefined7 uStack_170;
  undefined8 local_168;
  void *pvStack_160;
  undefined1 local_158;
  timeval local_150;
  undefined1 local_140 [40];
  fdb_file_handle *local_118;
  undefined4 local_104;
  
  pfStack_1d0 = (fdb_kvs_handle *)0x11a861;
  gettimeofday(&local_150,(__timezone_ptr_t)0x0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a866;
  memleak_start();
  uStack_170 = 0x3106002d;
  local_178 = 0x3032343e3e0508;
  uStack_171 = 0x31;
  local_168._0_2_ = 0x508;
  local_168._2_6_ = 0x313032343e3e;
  pvStack_160 = (void *)0x323106002d31;
  local_158 = 0;
  ptr_iterator = (fdb_kvs_handle **)local_188;
  local_188._0_7_ = 0x3931343e3e0508;
  local_188._7_4_ = 0x2d3939;
  local_1a8 = 0x3433343e3e0508;
  uStack_1a1 = 0x140a35;
  local_1b8 = (fdb_kvs_handle *)0x0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8e4;
  fdb_get_default_config();
  pfVar15 = (fdb_kvs_handle *)local_140;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a8f4;
  fdb_get_default_kvs_config();
  local_118 = (fdb_file_handle *)0x400;
  local_104 = 1;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a910;
  system("rm -rf  iterator_test* > errorlog.txt");
  ptr_fhandle_00 = (btree *)&local_190;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a927;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./iterator_test1",(fdb_config *)(local_140 + 0x18));
  ppfVar10 = &local_198;
  pfStack_1d0 = (fdb_kvs_handle *)0x11a942;
  fdb_kvs_open(local_190,ppfVar10,"db1",(fdb_kvs_config *)pfVar15);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a95a;
  fdb_kvs_open(local_190,&local_1b0,"db2",(fdb_kvs_config *)pfVar15);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a970;
  fdb_set_kv(local_198,&local_178,0xf,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a986;
  fdb_set_kv(local_198,&local_168,0x11,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11a991;
  fdb_commit(local_190,'\0');
  pfStack_1d0 = (fdb_kvs_handle *)0x11a9b4;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)&local_1c0,ptr_iterator,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ace5;
  do {
    pfStack_1d0 = (fdb_kvs_handle *)0x11a9ce;
    pfVar8 = local_1c0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pfStack_1d0 = (fdb_kvs_handle *)0x11acdb;
      iterator_manual_wal_flush();
      goto LAB_0011acdb;
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11a9e0;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11a9f3;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_1c0);
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa05;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa29;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,&local_1a8,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acea;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa40;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011acef;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa55;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa6e;
  fdb_set_kv(local_1b0,&local_178,0xf,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa87;
  fdb_set_kv(local_1b0,&local_168,0x11,(void *)0x0,0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11aa96;
  fdb_commit(local_190,'\x01');
  pfStack_1d0 = (fdb_kvs_handle *)0x11aaba;
  pfVar8 = local_1b0;
  fVar3 = fdb_iterator_init(local_1b0,(fdb_iterator **)ptr_iterator,local_188,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acf4;
  do {
    pfStack_1d0 = (fdb_kvs_handle *)0x11aad4;
    pfVar8 = local_1c0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acdb;
    pfStack_1d0 = (fdb_kvs_handle *)0x11aae6;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11aaf9;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_1c0);
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab0b;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab2f;
  pfVar8 = local_198;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,&local_1a8,0xb,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acf9;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab46;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011acfe;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab5b;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab7e;
  fVar3 = fdb_iterator_init(local_1b0,(fdb_iterator **)ptr_iterator,(void *)0x0,0,local_188,0xb,0);
  pfVar8 = local_1b0;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad03;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ab9f;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_seek((fdb_iterator *)local_1c0,local_188,0xb,'\x01');
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011ad08;
  ptr_iterator = &local_1c0;
  pfStack_1d0 = (fdb_kvs_handle *)0x11abb4;
  fdb_iterator_close((fdb_iterator *)local_1c0);
  pfStack_1d0 = (fdb_kvs_handle *)0x11abd7;
  fVar3 = fdb_iterator_init(local_198,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&local_1a8,0xb,0);
  pfVar8 = local_198;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad0d;
  pfStack_1d0 = (fdb_kvs_handle *)0x11abf8;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_seek((fdb_iterator *)local_1c0,&local_1a8,0xb,'\x01');
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad12;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ac0f;
  pfVar8 = local_1c0;
  fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac21;
    fdb_doc_free((fdb_doc *)local_1b8);
    local_1b8 = (fdb_kvs_handle *)0x0;
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac34;
    fVar3 = fdb_iterator_prev((fdb_iterator *)local_1c0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
      do {
        pfStack_1d0 = (fdb_kvs_handle *)0x11ac4b;
        pfVar8 = local_1c0;
        fVar3 = fdb_iterator_get((fdb_iterator *)local_1c0,(fdb_doc **)&local_1b8);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ace0;
        pfStack_1d0 = (fdb_kvs_handle *)0x11ac5d;
        fdb_doc_free((fdb_doc *)local_1b8);
        local_1b8 = (fdb_kvs_handle *)0x0;
        pfStack_1d0 = (fdb_kvs_handle *)0x11ac70;
        fVar3 = fdb_iterator_prev((fdb_iterator *)local_1c0);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac7f;
    fdb_iterator_close((fdb_iterator *)local_1c0);
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac89;
    fdb_close(local_190);
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac8e;
    fdb_shutdown();
    pfStack_1d0 = (fdb_kvs_handle *)0x11ac93;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (iterator_manual_wal_flush()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pfStack_1d0 = (fdb_kvs_handle *)0x11acc4;
    fprintf(_stderr,pcVar13,"iterator manual wal flush");
    return;
  }
  goto LAB_0011ad17;
LAB_0011b2d3:
  pfStack_698 = (fdb_kvs_handle *)0x11b2de;
  sequence_iterator_seek_test();
  pfVar16 = pfVar11;
LAB_0011b2de:
  pfVar11 = pfVar16;
  pfStack_698 = (fdb_kvs_handle *)0x11b2e3;
  sequence_iterator_seek_test();
LAB_0011b2e3:
  pfStack_698 = (fdb_kvs_handle *)0x11b2ee;
  sequence_iterator_seek_test();
LAB_0011b2ee:
  pfStack_698 = (fdb_kvs_handle *)0x11b2f9;
  sequence_iterator_seek_test();
LAB_0011b2f9:
  pfStack_698 = (fdb_kvs_handle *)0x11b304;
  sequence_iterator_seek_test();
  pfVar16 = pfVar11;
  goto LAB_0011b304;
LAB_0011b623:
  ppfVar10 = &pfStack_a30;
  ppfStack_a40 = (fdb_doc **)0x11b628;
  iterator_concurrent_compaction();
  goto LAB_0011b628;
LAB_0011bb51:
  ppfStack_2d18 = (fdb_doc **)0x11bb56;
  iterator_offset_access_test();
LAB_0011bb56:
  ppfStack_2d18 = (fdb_doc **)0x11bb5b;
  iterator_offset_access_test();
LAB_0011bb5b:
  ppfStack_2d18 = (fdb_doc **)0x11bb60;
  iterator_offset_access_test();
LAB_0011bb60:
  ppfStack_2d18 = (fdb_doc **)0x11bb65;
  iterator_offset_access_test();
LAB_0011bb65:
  ppfStack_2d18 = (fdb_doc **)0x11bb6a;
  iterator_offset_access_test();
LAB_0011bb6a:
  ppfStack_2d18 = (fdb_doc **)0x11bb6f;
  iterator_offset_access_test();
LAB_0011bb6f:
  ppfStack_2d18 = (fdb_doc **)0x11bb74;
  iterator_offset_access_test();
  goto LAB_0011bb74;
LAB_0011acdb:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ace0;
  iterator_manual_wal_flush();
LAB_0011ace0:
  ptr_iterator = &local_1b8;
  pfStack_1d0 = (fdb_kvs_handle *)0x11ace5;
  iterator_manual_wal_flush();
LAB_0011ace5:
  pfStack_1d0 = (fdb_kvs_handle *)0x11acea;
  iterator_manual_wal_flush();
LAB_0011acea:
  pfStack_1d0 = (fdb_kvs_handle *)0x11acef;
  iterator_manual_wal_flush();
LAB_0011acef:
  pfStack_1d0 = (fdb_kvs_handle *)0x11acf4;
  iterator_manual_wal_flush();
LAB_0011acf4:
  pfStack_1d0 = (fdb_kvs_handle *)0x11acf9;
  iterator_manual_wal_flush();
LAB_0011acf9:
  pfStack_1d0 = (fdb_kvs_handle *)0x11acfe;
  iterator_manual_wal_flush();
LAB_0011acfe:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ad03;
  iterator_manual_wal_flush();
LAB_0011ad03:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ad08;
  iterator_manual_wal_flush();
LAB_0011ad08:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ad0d;
  iterator_manual_wal_flush();
LAB_0011ad0d:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ad12;
  iterator_manual_wal_flush();
LAB_0011ad12:
  pfStack_1d0 = (fdb_kvs_handle *)0x11ad17;
  iterator_manual_wal_flush();
LAB_0011ad17:
  pfStack_1d0 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar8 & 0xffffffff);
  pfStack_698 = (fdb_kvs_handle *)0x11ad41;
  ppfStack_1f8 = ptr_iterator;
  pbStack_1f0 = ptr_fhandle_00;
  ppfStack_1e8 = ppfVar10;
  puStack_1e0 = &local_168;
  puStack_1d8 = &local_178;
  pfStack_1d0 = pfVar15;
  gettimeofday(&tStack_600,(__timezone_ptr_t)0x0);
  pfStack_698 = (fdb_kvs_handle *)0x11ad46;
  memleak_start();
  pfStack_680 = (fdb_config *)0x0;
  pfStack_698 = (fdb_kvs_handle *)0x11ad57;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar11 = &fStack_2f0;
  pfStack_698 = (fdb_kvs_handle *)0x11ad67;
  fdb_get_default_config();
  pfStack_698 = (fdb_kvs_handle *)0x11ad71;
  fdb_get_default_kvs_config();
  fStack_2f0.buffercache_size = 0;
  fStack_2f0.wal_threshold = 0x400;
  fStack_2f0.seqtree_opt = '\x01';
  fStack_2f0.flags = 1;
  fStack_2f0.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_2f0.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_670;
  pfStack_698 = (fdb_kvs_handle *)0x11adaa;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar11);
  if ((int)pfVar8 == 0) {
    pfStack_698 = (fdb_kvs_handle *)0x11add8;
    fdb_kvs_open_default(pfStack_670,&pfStack_678,&fStack_668);
  }
  else {
    pfStack_698 = (fdb_kvs_handle *)0x11adc7;
    fdb_kvs_open(pfStack_670,&pfStack_678,"kv1",&fStack_668);
  }
  pfStack_698 = (fdb_kvs_handle *)0x11adf0;
  fVar3 = fdb_set_log_callback(pfStack_678,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar14 = 0;
    uVar9 = 0;
    do {
      pfVar1 = &fStack_5f0.config.encryption_key;
      pfStack_698 = (fdb_kvs_handle *)0x11ae18;
      sprintf((char *)pfVar1,"key%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11ae30;
      sprintf((char *)&fStack_5f0.bub_ctx.handle,"meta%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11ae48;
      sprintf((char *)&fStack_5f0,"body%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11ae58;
      sVar5 = strlen((char *)pfVar1);
      ppfVar10 = &fStack_5f0.bub_ctx.handle;
      pfStack_698 = (fdb_kvs_handle *)0x11ae6b;
      sVar6 = strlen((char *)ppfVar10);
      pfStack_698 = (fdb_kvs_handle *)0x11ae7b;
      sVar7 = strlen((char *)&fStack_5f0);
      pfStack_698 = (fdb_kvs_handle *)0x11aea0;
      fdb_doc_create((fdb_doc **)((long)apfStack_650 + lVar14),&fStack_5f0.config.encryption_key,
                     sVar5,ppfVar10,sVar6,&fStack_5f0,sVar7);
      pfStack_698 = (fdb_kvs_handle *)0x11aeaf;
      fdb_set(pfStack_678,apfStack_650[uVar9]);
      uVar9 = uVar9 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar9 != 5);
    pfStack_698 = (fdb_kvs_handle *)0x11aecf;
    fdb_commit(pfStack_670,'\x01');
    uVar9 = 5;
    pfVar11 = (fdb_config *)apfStack_628;
    do {
      pfVar1 = &fStack_5f0.config.encryption_key;
      pfStack_698 = (fdb_kvs_handle *)0x11aef4;
      sprintf((char *)pfVar1,"key%d",uVar9 & 0xffffffff);
      ppfVar10 = &fStack_5f0.bub_ctx.handle;
      pfStack_698 = (fdb_kvs_handle *)0x11af0f;
      sprintf((char *)ppfVar10,"meta%d",uVar9 & 0xffffffff);
      pfVar15 = &fStack_5f0;
      pfStack_698 = (fdb_kvs_handle *)0x11af2a;
      sprintf((char *)pfVar15,"body%d",uVar9 & 0xffffffff);
      pfStack_698 = (fdb_kvs_handle *)0x11af32;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_698 = (fdb_kvs_handle *)0x11af3d;
      ptr_fhandle_00 = (btree *)strlen((char *)ppfVar10);
      pfStack_698 = (fdb_kvs_handle *)0x11af48;
      sVar5 = strlen((char *)pfVar15);
      pfStack_698 = (fdb_kvs_handle *)0x11af68;
      fdb_doc_create((fdb_doc **)pfVar11,&fStack_5f0.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar10,(size_t)ptr_fhandle_00,pfVar15,sVar5);
      pfStack_698 = (fdb_kvs_handle *)0x11af75;
      fdb_set(pfStack_678,(fdb_doc *)*(fdb_kvs_handle **)pfVar11);
      uVar9 = uVar9 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar9 != 10);
    pfStack_698 = (fdb_kvs_handle *)0x11af92;
    fdb_commit(pfStack_670,'\0');
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11afab;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_698 = (fdb_kvs_handle *)0x11afb3;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b324;
    ppfVar10 = apfStack_628 + 4;
    pfVar16 = pfVar11;
    do {
      pfStack_698 = (fdb_kvs_handle *)0x11afd5;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
      pfVar11 = pfStack_680;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011b2b8:
        pfStack_698 = (fdb_kvs_handle *)0x11b2bd;
        sequence_iterator_seek_test();
        pfVar11 = pfVar16;
LAB_0011b2bd:
        pfStack_698 = (fdb_kvs_handle *)0x11b2c8;
        sequence_iterator_seek_test();
LAB_0011b2c8:
        pfStack_698 = (fdb_kvs_handle *)0x11b2d3;
        sequence_iterator_seek_test();
        goto LAB_0011b2d3;
      }
      sVar5._0_2_ = pfStack_680->chunksize;
      sVar5._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
      sVar5._4_4_ = pfStack_680->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
      pfVar15 = *ppfVar10;
      ptr_fhandle_00 = (btree *)pfVar15->op_stats;
      pfStack_698 = (fdb_kvs_handle *)0x11affc;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar5);
      pfVar16 = pfVar11;
      if (iVar4 != 0) {
        pfStack_698 = (fdb_kvs_handle *)0x11b2b8;
        sequence_iterator_seek_test();
        goto LAB_0011b2b8;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar15->staletree;
      pfStack_698 = (fdb_kvs_handle *)0x11b01b;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b2c8;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
      ptr_fhandle_00 = (pfVar15->field_6).seqtree;
      pfStack_698 = (fdb_kvs_handle *)0x11b03a;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b2bd;
      pfStack_698 = (fdb_kvs_handle *)0x11b04a;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_680 = (fdb_config *)0x0;
      pfStack_698 = (fdb_kvs_handle *)0x11b05d;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
      ppfVar10 = ppfVar10 + -1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11b077;
    fdb_iterator_close((fdb_iterator *)pfStack_688);
    pfStack_698 = (fdb_kvs_handle *)0x11b08e;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_698 = (fdb_kvs_handle *)0x11b096;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b329;
    ppfVar10 = apfStack_628 + 1;
    do {
      pfStack_698 = (fdb_kvs_handle *)0x11b0b5;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
      pfVar11 = pfStack_680;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b2de;
      sVar6._0_2_ = pfStack_680->chunksize;
      sVar6._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
      sVar6._4_4_ = pfStack_680->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
      pfVar15 = *ppfVar10;
      ptr_fhandle_00 = (btree *)pfVar15->op_stats;
      pfStack_698 = (fdb_kvs_handle *)0x11b0dc;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar6);
      if (iVar4 != 0) goto LAB_0011b2d3;
      ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar15->staletree;
      pfStack_698 = (fdb_kvs_handle *)0x11b0fb;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b2ee;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
      ptr_fhandle_00 = (pfVar15->field_6).seqtree;
      pfStack_698 = (fdb_kvs_handle *)0x11b11a;
      iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b2e3;
      pfStack_698 = (fdb_kvs_handle *)0x11b12a;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_680 = (fdb_config *)0x0;
      pfStack_698 = (fdb_kvs_handle *)0x11b13d;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
      ppfVar10 = ppfVar10 + -1;
      pfVar16 = pfVar11;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_688;
    pfStack_698 = (fdb_kvs_handle *)0x11b157;
    fdb_iterator_close((fdb_iterator *)pfStack_688);
    pfStack_698 = (fdb_kvs_handle *)0x11b171;
    fdb_iterator_sequence_init(pfStack_678,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_698 = (fdb_kvs_handle *)0x11b179;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_688);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfVar10 = apfStack_628;
      while( true ) {
        pfStack_698 = (fdb_kvs_handle *)0x11b198;
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_688,(fdb_doc **)&pfStack_680);
        pfVar11 = pfStack_680;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sVar7._0_2_ = pfStack_680->chunksize;
        sVar7._2_2_ = *(undefined2 *)&pfStack_680->field_0x2;
        sVar7._4_4_ = pfStack_680->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_680->seqtree_opt;
        pfVar15 = *ppfVar10;
        ptr_fhandle_00 = (btree *)pfVar15->op_stats;
        pfStack_698 = (fdb_kvs_handle *)0x11b1bf;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar7);
        if (iVar4 != 0) goto LAB_0011b2f9;
        ptr_fhandle = (fdb_file_handle **)pfVar11->compactor_sleep_duration;
        ptr_fhandle_00 = pfVar15->staletree;
        pfStack_698 = (fdb_kvs_handle *)0x11b1de;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->buffercache_size);
        if (iVar4 != 0) goto LAB_0011b314;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar11->multi_kv_instances;
        ptr_fhandle_00 = (pfVar15->field_6).seqtree;
        pfStack_698 = (fdb_kvs_handle *)0x11b1fd;
        iVar4 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar11->wal_threshold);
        if (iVar4 != 0) goto LAB_0011b309;
        pfStack_698 = (fdb_kvs_handle *)0x11b20d;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_680 = (fdb_config *)0x0;
        pfStack_698 = (fdb_kvs_handle *)0x11b220;
        fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_688);
        ppfVar10 = ppfVar10 + -1;
        pfVar16 = pfVar11;
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_698 = (fdb_kvs_handle *)0x11b237;
          fdb_iterator_close((fdb_iterator *)pfStack_688);
          pfStack_698 = (fdb_kvs_handle *)0x11b241;
          fdb_kvs_close(pfStack_678);
          pfStack_698 = (fdb_kvs_handle *)0x11b24b;
          fdb_close(pfStack_670);
          lVar14 = 0;
          do {
            pfStack_698 = (fdb_kvs_handle *)0x11b257;
            fdb_doc_free(apfStack_650[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 10);
          pfStack_698 = (fdb_kvs_handle *)0x11b265;
          fdb_shutdown();
          pfStack_698 = (fdb_kvs_handle *)0x11b26a;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_698 = (fdb_kvs_handle *)0x11b29b;
          fprintf(_stderr,pcVar13,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b304:
      pfVar11 = pfVar16;
      pfStack_698 = (fdb_kvs_handle *)0x11b309;
      sequence_iterator_seek_test();
LAB_0011b309:
      pfStack_698 = (fdb_kvs_handle *)0x11b314;
      sequence_iterator_seek_test();
LAB_0011b314:
      ptr_iterator_00 = &pfStack_680;
      pfStack_698 = (fdb_kvs_handle *)0x11b31f;
      sequence_iterator_seek_test();
      goto LAB_0011b31f;
    }
  }
  else {
LAB_0011b31f:
    pfStack_698 = (fdb_kvs_handle *)0x11b324;
    sequence_iterator_seek_test();
LAB_0011b324:
    pfStack_698 = (fdb_kvs_handle *)0x11b329;
    sequence_iterator_seek_test();
LAB_0011b329:
    pfStack_698 = (fdb_kvs_handle *)0x11b32e;
    sequence_iterator_seek_test();
  }
  pfStack_698 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_a40 = (fdb_doc **)0x11b350;
  ppfStack_6c0 = ptr_iterator_00;
  pbStack_6b8 = ptr_fhandle_00;
  ppfStack_6b0 = ppfVar10;
  pfStack_6a8 = pfVar11;
  ppfStack_6a0 = ptr_fhandle;
  pfStack_698 = pfVar15;
  gettimeofday((timeval *)(auStack_9f8 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_a40 = (fdb_doc **)0x11b355;
  memleak_start();
  pfStack_a30 = (fdb_kvs_handle *)0x0;
  ppfStack_a40 = (fdb_doc **)0x11b36b;
  fdb_get_default_config();
  ppfStack_a40 = (fdb_doc **)0x11b378;
  fdb_get_default_kvs_config();
  fStack_9c0.wal_threshold = 0x400;
  fStack_9c0.seqtree_opt = '\x01';
  fStack_9c0.flags = 1;
  ppfStack_a40 = (fdb_doc **)0x11b397;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_a40 = (fdb_doc **)0x11b3ae;
  fdb_open(&pfStack_a10,"./iterator_test1",&fStack_9c0);
  ppfStack_a40 = (fdb_doc **)0x11b3c5;
  fdb_kvs_open(pfStack_a10,&pfStack_a18,"db",(fdb_kvs_config *)(auStack_9f8 + 0x10));
  pcVar13 = "body%d";
  pfVar15 = (fdb_kvs_handle *)(apfStack_8c8 + 0x20);
  doc = (fdb_doc **)0x0;
  do {
    ppfStack_a40 = (fdb_doc **)0x11b3f1;
    sprintf((char *)apfStack_8c8,"key%d",doc);
    ppfStack_a40 = (fdb_doc **)0x11b400;
    sprintf((char *)pfVar15,"body%d",doc);
    pfVar8 = pfStack_a18;
    ppfStack_a40 = (fdb_doc **)0x11b40d;
    sVar5 = strlen((char *)apfStack_8c8);
    ppfStack_a40 = (fdb_doc **)0x11b418;
    sVar6 = strlen((char *)pfVar15);
    ppfStack_a40 = (fdb_doc **)0x11b42c;
    fdb_set_kv(pfVar8,apfStack_8c8,sVar5,pfVar15,sVar6);
    uVar12 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar12;
  } while (uVar12 != 10);
  ppfStack_a40 = (fdb_doc **)0x11b43f;
  fdb_commit(pfStack_a10,'\0');
  ppfStack_a40 = (fdb_doc **)0x11b458;
  fdb_open(&pfStack_a00,"./iterator_test1",&fStack_9c0);
  ppfVar10 = (fdb_kvs_handle **)(auStack_9f8 + 8);
  ppfStack_a40 = (fdb_doc **)0x11b474;
  fdb_kvs_open(pfStack_a00,ppfVar10,"db",(fdb_kvs_config *)(auStack_9f8 + 0x10));
  ppfStack_a40 = (fdb_doc **)0x11b485;
  fdb_compact(pfStack_a10,"./iterator_test2");
  ppfStack_a40 = (fdb_doc **)0x11b4a3;
  fVar3 = fdb_iterator_init((fdb_kvs_handle *)auStack_9f8._8_8_,&pfStack_a20,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_a40 = (fdb_doc **)0x11b4c1;
    fVar3 = fdb_iterator_sequence_init(pfStack_a18,&pfStack_a28,0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b62d;
    pcVar13 = (char *)&pfStack_a08;
    pfVar15 = (fdb_kvs_handle *)auStack_9f8;
    doc = (fdb_doc **)0x0;
    do {
      ppfStack_a40 = (fdb_doc **)0x11b4f3;
      sprintf((char *)apfStack_8c8,"key%d",doc);
      pfVar8 = pfStack_a18;
      ppfStack_a40 = (fdb_doc **)0x11b500;
      sVar5 = strlen((char *)apfStack_8c8);
      ppfStack_a40 = (fdb_doc **)0x11b514;
      fdb_get_kv(pfVar8,apfStack_8c8,sVar5,(void **)pcVar13,(size_t *)pfVar15);
      ppfStack_a40 = (fdb_doc **)0x11b51e;
      fdb_free_block(pfStack_a08);
      uVar12 = (int)doc + 1;
      doc = (fdb_doc **)(ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = &pfStack_a30;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x0;
      ppfStack_a40 = (fdb_doc **)0x11b540;
      fVar3 = fdb_iterator_get(pfStack_a20,(fdb_doc **)ppfVar10);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_a40 = (fdb_doc **)0x11b623;
        iterator_concurrent_compaction();
        goto LAB_0011b623;
      }
      ppfStack_a40 = (fdb_doc **)0x11b552;
      fdb_doc_free((fdb_doc *)pfStack_a30);
      ppfStack_a40 = (fdb_doc **)0x11b55c;
      fVar3 = fdb_iterator_next(pfStack_a20);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_a40 = (fdb_doc **)0x11b56b;
    fVar3 = fdb_iterator_close(pfStack_a20);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b632;
    ppfVar10 = &pfStack_a30;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x0;
      ppfStack_a40 = (fdb_doc **)0x11b58e;
      fVar3 = fdb_iterator_get(pfStack_a28,(fdb_doc **)ppfVar10);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b623;
      ppfStack_a40 = (fdb_doc **)0x11b5a0;
      fdb_doc_free((fdb_doc *)pfStack_a30);
      ppfStack_a40 = (fdb_doc **)0x11b5aa;
      fVar3 = fdb_iterator_next(pfStack_a28);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_a40 = (fdb_doc **)0x11b5b9;
    fVar3 = fdb_iterator_close(pfStack_a28);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfStack_a40 = (fdb_doc **)0x11b5c7;
      fdb_close(pfStack_a10);
      ppfStack_a40 = (fdb_doc **)0x11b5d1;
      fdb_close(pfStack_a00);
      ppfStack_a40 = (fdb_doc **)0x11b5d6;
      fdb_shutdown();
      ppfStack_a40 = (fdb_doc **)0x11b5db;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      ppfStack_a40 = (fdb_doc **)0x11b60c;
      fprintf(_stderr,pcVar13,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b628:
    ppfStack_a40 = (fdb_doc **)0x11b62d;
    iterator_concurrent_compaction();
LAB_0011b62d:
    ppfStack_a40 = (fdb_doc **)0x11b632;
    iterator_concurrent_compaction();
LAB_0011b632:
    ppfStack_a40 = (fdb_doc **)0x11b637;
    iterator_concurrent_compaction();
  }
  doc_01 = (char *)apfStack_8c8;
  ppfStack_a40 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_2d18 = (fdb_doc **)0x11b659;
  ppfStack_a68 = ppfVar10;
  pfStack_a60 = pfVar15;
  ppfStack_a50 = (fdb_doc **)doc_01;
  ppfStack_a48 = (fdb_doc **)pcVar13;
  ppfStack_a40 = doc;
  gettimeofday(&tStack_2cc0,(__timezone_ptr_t)0x0);
  ppfStack_2d18 = (fdb_doc **)0x11b65e;
  memleak_start();
  pfStack_2cf0 = (fdb_doc *)0x0;
  ppfStack_2d18 = (fdb_doc **)0x11b673;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)(auStack_2bb0 + 0x108);
  ppfStack_2d18 = (fdb_doc **)0x11b683;
  fdb_get_default_config();
  ppfStack_2d18 = (fdb_doc **)0x11b68d;
  fdb_get_default_kvs_config();
  auStack_2aa0[8] = '\0';
  auStack_2aa0[9] = '\x02';
  auStack_2aa0[10] = '\0';
  auStack_2aa0[0xb] = '\0';
  auStack_2aa0[0xc] = '\0';
  auStack_2aa0[0xd] = '\0';
  auStack_2aa0[0xe] = '\0';
  auStack_2aa0[0xf] = '\0';
  auStack_2aa0[0] = '\0';
  auStack_2aa0[1] = '\x10';
  auStack_2aa0[2] = '\0';
  auStack_2aa0[3] = '\0';
  auStack_2aa0[4] = '\0';
  auStack_2aa0[5] = '\0';
  auStack_2aa0[6] = '\0';
  auStack_2aa0[7] = '\0';
  uStack_2a84 = 1;
  uStack_2a7a = 0;
  uStack_2a8c = 1;
  ppfStack_2d18 = (fdb_doc **)0x11b6c0;
  fVar3 = fdb_open(&pfStack_2d00,"./iterator_test1",(fdb_config *)pfVar8);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_2d18 = (fdb_doc **)0x11b6e3;
    fVar3 = fdb_kvs_open(pfStack_2d00,&pfStack_2d08,"DB",&fStack_2cd8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb7e;
    ppfStack_2d18 = (fdb_doc **)0x11b706;
    fVar3 = fdb_kvs_open(pfStack_2d00,&pfStack_2ce8,"ODB",&fStack_2cd8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb83;
    doc_01 = (char *)apfStack_2cb0;
    pfVar15 = (fdb_kvs_handle *)auStack_2bb0;
    pcVar13 = (char *)0x0;
    uVar9 = 0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b735;
      sprintf(doc_01,"key%d",uVar9 & 0xffffffff);
      ppfStack_2d18 = (fdb_doc **)0x11b749;
      sprintf((char *)pfVar15,"body%d",uVar9 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_29b0 + (long)pcVar13);
      ppfStack_2d18 = (fdb_doc **)0x11b75c;
      pfVar8 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_2d18 = (fdb_doc **)0x11b767;
      sVar5 = strlen((char *)pfVar15);
      ppfStack_2d18 = (fdb_doc **)0x11b781;
      fdb_doc_create(doc,doc_01,(size_t)pfVar8,(void *)0x0,0,pfVar15,sVar5);
      ppfStack_2d18 = (fdb_doc **)0x11b793;
      fVar3 = fdb_set(pfStack_2d08,apfStack_29b0[uVar9]);
      pfVar2 = pfStack_2ce8;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011bb4c:
        ppfStack_2d18 = (fdb_doc **)0x11bb51;
        iterator_offset_access_test();
        goto LAB_0011bb51;
      }
      ppfStack_2d18 = (fdb_doc **)0x11b7a8;
      sVar5 = strlen(doc_01);
      ppfStack_2d18 = (fdb_doc **)0x11b7c8;
      fVar3 = fdb_set_kv(pfVar2,doc_01,sVar5,&apfStack_29b0[uVar9]->offset,8);
      pfVar8 = pfVar2;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_2d18 = (fdb_doc **)0x11bb4c;
        iterator_offset_access_test();
        goto LAB_0011bb4c;
      }
      uVar9 = uVar9 + 1;
      pcVar13 = (char *)((long)pcVar13 + 8);
    } while (uVar9 != 1000);
    ppfStack_2d18 = (fdb_doc **)0x11b7f3;
    fVar3 = fdb_commit(pfStack_2d00,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb88;
    pfVar8 = (fdb_kvs_handle *)0xfa;
    doc_01 = "key%d";
    pcVar13 = (char *)apfStack_2cb0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b81b;
      sprintf(pcVar13,"key%d",pfVar8);
      pfVar15 = pfStack_2d08;
      ppfStack_2d18 = (fdb_doc **)0x11b828;
      sVar5 = strlen(pcVar13);
      ppfStack_2d18 = (fdb_doc **)0x11b836;
      fVar3 = fdb_del_kv(pfVar15,pcVar13,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb51;
      uVar12 = (int)pfVar8 + 1;
      pfVar8 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar12 != 500);
    doc_01 = (char *)apfStack_2cb0;
    pfVar15 = (fdb_kvs_handle *)auStack_2bb0;
    pcVar13 = (char *)0x0;
    uVar9 = 0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b86f;
      sprintf(doc_01,"k0y%d",uVar9 & 0xffffffff);
      ppfStack_2d18 = (fdb_doc **)0x11b883;
      sprintf((char *)pfVar15,"b0dy%d",uVar9 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_29b0 + (long)pcVar13);
      ppfStack_2d18 = (fdb_doc **)0x11b89b;
      fdb_doc_free(apfStack_29b0[uVar9]);
      ppfStack_2d18 = (fdb_doc **)0x11b8a3;
      pfVar8 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_2d18 = (fdb_doc **)0x11b8ae;
      sVar5 = strlen((char *)pfVar15);
      ppfStack_2d18 = (fdb_doc **)0x11b8c8;
      fdb_doc_create(doc,doc_01,(size_t)pfVar8,(void *)0x0,0,pfVar15,sVar5);
      ppfStack_2d18 = (fdb_doc **)0x11b8da;
      fVar3 = fdb_set(pfStack_2d08,apfStack_29b0[uVar9]);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb56;
      uVar9 = uVar9 + 1;
      pcVar13 = (char *)((long)pcVar13 + 8);
    } while (uVar9 != 0xfa);
    ppfStack_2d18 = (fdb_doc **)0x11b902;
    fVar3 = fdb_commit(pfStack_2d00,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb8d;
    ppfStack_2d18 = (fdb_doc **)0x11b92a;
    fdb_iterator_init(pfStack_2ce8,&pfStack_2cf8,(void *)0x0,0,(void *)0x0,0,2);
    pfVar15 = (fdb_kvs_handle *)0x1ea;
    pfVar8 = afStack_1a10;
    doc_01 = (char *)&pfStack_2cf0;
    pcVar13 = (char *)&pfStack_2ce0;
    do {
      ppfStack_2d18 = (fdb_doc **)0x11b94f;
      fVar3 = fdb_get_byoffset(pfStack_2d08,*(fdb_doc **)&pfVar8->kvs_config);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb60;
      ppfStack_2d18 = (fdb_doc **)0x11b96d;
      fVar3 = fdb_iterator_seek(pfStack_2cf8,(void *)(*(size_t **)&pfVar8->kvs_config)[4],
                                **(size_t **)&pfVar8->kvs_config,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb5b;
      ppfStack_2d18 = (fdb_doc **)0x11b982;
      fVar3 = fdb_iterator_get(pfStack_2cf8,(fdb_doc **)doc_01);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb6a;
      doc_00 = *(fdb_doc **)&pfVar8->kvs_config;
      if (*pfStack_2cf0->body != (*(fdb_doc **)&pfVar8->kvs_config)->offset) {
        ppfStack_2d18 = (fdb_doc **)0x11b9e3;
        iterator_offset_access_test();
        doc_00 = pfStack_2ce0;
      }
      ppfStack_2d18 = (fdb_doc **)0x11b9a9;
      fVar3 = fdb_del(pfStack_2d08,doc_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb65;
      ppfStack_2d18 = (fdb_doc **)0x11b9be;
      fdb_get_metaonly(pfStack_2d08,*(fdb_doc **)&pfVar8->kvs_config);
      pfVar15 = (fdb_kvs_handle *)((long)&(pfVar15->kvs_config).custom_cmp + 2);
      pfVar8 = (fdb_kvs_handle *)&pfVar8->dhandle;
    } while (pfVar15 < (fdb_kvs_handle *)0x3de);
    ppfStack_2d18 = (fdb_doc **)0x11b9f4;
    fdb_iterator_close(pfStack_2cf8);
    ppfStack_2d18 = (fdb_doc **)0x11ba03;
    fVar3 = fdb_commit(pfStack_2d00,'\x01');
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc_01 = (char *)apfStack_2cb0;
      pcVar13 = "b1dy%d";
      pfVar15 = (fdb_kvs_handle *)auStack_2bb0;
      doc = (fdb_doc **)0x0;
      do {
        ppfStack_2d18 = (fdb_doc **)0x11ba34;
        sprintf(doc_01,"k1y%d",doc);
        ppfStack_2d18 = (fdb_doc **)0x11ba43;
        sprintf((char *)pfVar15,"b1dy%d",doc);
        pfVar2 = pfStack_2d08;
        ppfStack_2d18 = (fdb_doc **)0x11ba50;
        pfVar8 = (fdb_kvs_handle *)strlen(doc_01);
        ppfStack_2d18 = (fdb_doc **)0x11ba5b;
        sVar5 = strlen((char *)pfVar15);
        ppfStack_2d18 = (fdb_doc **)0x11ba6f;
        fVar3 = fdb_set_kv(pfVar2,doc_01,(size_t)pfVar8,pfVar15,sVar5);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb6f;
        uVar12 = (int)doc + 1;
        doc = (fdb_doc **)(ulong)uVar12;
      } while (uVar12 != 0xfa);
      doc_01 = (char *)0x1ea;
      pfVar8 = afStack_1a10;
      while( true ) {
        ppfStack_2d18 = (fdb_doc **)0x11ba9c;
        fVar3 = fdb_get_byoffset(pfStack_2d08,*(fdb_doc **)&pfVar8->kvs_config);
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar8->kvs_config + 0x48) == '\0') {
          ppfStack_2d18 = (fdb_doc **)0x11bac9;
          iterator_offset_access_test();
        }
        doc_01 = (char *)((long)doc_01 + 10);
        pfVar8 = (fdb_kvs_handle *)&pfVar8->dhandle;
        if ((fdb_doc **)0x3dd < doc_01) {
          lVar14 = 0;
          do {
            ppfStack_2d18 = (fdb_doc **)0x11bada;
            fdb_doc_free(apfStack_29b0[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 1000);
          ppfStack_2d18 = (fdb_doc **)0x11baf0;
          fdb_doc_free(pfStack_2cf0);
          ppfStack_2d18 = (fdb_doc **)0x11bafa;
          fdb_close(pfStack_2d00);
          ppfStack_2d18 = (fdb_doc **)0x11baff;
          fdb_shutdown();
          ppfStack_2d18 = (fdb_doc **)0x11bb04;
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          ppfStack_2d18 = (fdb_doc **)0x11bb35;
          fprintf(_stderr,pcVar13,"iterator offset access test");
          return;
        }
      }
LAB_0011bb74:
      ppfStack_2d18 = (fdb_doc **)0x11bb79;
      iterator_offset_access_test();
      goto LAB_0011bb79;
    }
  }
  else {
LAB_0011bb79:
    ppfStack_2d18 = (fdb_doc **)0x11bb7e;
    iterator_offset_access_test();
LAB_0011bb7e:
    ppfStack_2d18 = (fdb_doc **)0x11bb83;
    iterator_offset_access_test();
LAB_0011bb83:
    ppfStack_2d18 = (fdb_doc **)0x11bb88;
    iterator_offset_access_test();
LAB_0011bb88:
    ppfStack_2d18 = (fdb_doc **)0x11bb8d;
    iterator_offset_access_test();
LAB_0011bb8d:
    ppfStack_2d18 = (fdb_doc **)0x11bb92;
    iterator_offset_access_test();
  }
  ppfStack_2d18 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_31a0 = (fdb_iterator **)0x11bbb2;
  pfStack_2d38 = pfVar8;
  pfStack_2d30 = pfVar15;
  ppfStack_2d28 = (fdb_doc **)doc_01;
  ppfStack_2d20 = (fdb_doc **)pcVar13;
  ppfStack_2d18 = doc;
  gettimeofday(&tStack_3168,(__timezone_ptr_t)0x0);
  ppfStack_31a0 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_31a0 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  fStack_2f30.buffercache_size = 0;
  ppfStack_31a0 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_31a0 = (fdb_iterator **)0x11bc02;
  sprintf(acStack_3038,"rm -rf  %s*","./dummy");
  ppfStack_31a0 = (fdb_iterator **)0x11bc0a;
  system(acStack_3038);
  ppfStack_31a0 = (fdb_iterator **)0x11bc1d;
  fdb_open(&pfStack_3170,"./dummy",&fStack_2f30);
  ppfStack_31a0 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(pfStack_3170,&pfStack_3178,(char *)0x0,&fStack_3050);
  uVar9 = 0;
  do {
    ppfStack_31a0 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)apfStack_3158,"k%06d\n",uVar9);
    ppfStack_31a0 = (fdb_iterator **)0x11bc6b;
    sprintf(acStack_2e38,"v%06d\n",uVar9);
    ppfStack_31a0 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(pfStack_3178,apfStack_3158,8,acStack_2e38,8);
    uVar12 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar12;
  } while (uVar12 != 3);
  ppfStack_31a0 = (fdb_iterator **)0x11bca8;
  sprintf((char *)apfStack_3158,"k%06d\n",1);
  ppfStack_31a0 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(pfStack_3178,apfStack_3158,8);
  ppfStack_31a0 = (fdb_iterator **)0x11bcc6;
  fdb_commit(pfStack_3170,'\0');
  apfStack_3158[0]._0_2_ = 0x61;
  acStack_3038[0] = 'z';
  acStack_3038[1] = '\0';
  ppfStack_31a0 = (fdb_iterator **)0x11bcfd;
  fVar3 = fdb_iterator_init(pfStack_3178,&pfStack_3188,apfStack_3158,1,acStack_3038,1,2);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_31a0 = (fdb_iterator **)0x11bd0f;
    fVar3 = fdb_iterator_seek_to_max(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bd2d;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_31a0 = (fdb_iterator **)0x11bd50;
    sprintf((char *)apfStack_3158,"k%06d\n",2);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bf42;
    ppfStack_31a0 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(pfStack_3180);
    ppfStack_31a0 = (fdb_iterator **)0x11bd74;
    fVar3 = fdb_iterator_prev(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11bd92;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_31a0 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)apfStack_3158,"k%06d\n",0);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bf56;
    ppfStack_31a0 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(pfStack_3180);
    ptr_iterator_01 = &pfStack_3188;
    ppfStack_31a0 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(pfStack_3188);
    ppfStack_31a0 = (fdb_iterator **)0x11be05;
    fVar3 = fdb_iterator_init(pfStack_3178,ptr_iterator_01,apfStack_3158,1,acStack_3038,1,2);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_31a0 = (fdb_iterator **)0x11be17;
    fVar3 = fdb_iterator_seek_to_min(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11be35;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11be55;
    sprintf((char *)ptr_iterator_01,"k%06d\n",0);
    if (*pfStack_3180->key != CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_))
    goto LAB_0011bf6f;
    ppfStack_31a0 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(pfStack_3180);
    ppfStack_31a0 = (fdb_iterator **)0x11be79;
    fVar3 = fdb_iterator_next(pfStack_3188);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    pfStack_3180 = (fdb_doc *)0x0;
    ppfStack_31a0 = (fdb_iterator **)0x11be97;
    fVar3 = fdb_iterator_get(pfStack_3188,&pfStack_3180);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11beba;
    sprintf((char *)ptr_iterator_01,"k%06d\n",2);
    if (*pfStack_3180->key == CONCAT62(apfStack_3158[0]._2_6_,apfStack_3158[0]._0_2_)) {
      ppfStack_31a0 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(pfStack_3180);
      ppfStack_31a0 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(pfStack_3188);
      ppfStack_31a0 = (fdb_iterator **)0x11bee8;
      fdb_close(pfStack_3170);
      ppfStack_31a0 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_31a0 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      ppfStack_31a0 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar13,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_31a0 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_31a0 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_31a0 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_31a0 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_31a0 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_31a0 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ptr_iterator_01 = apfStack_3158;
    ppfStack_31a0 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_31a0 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_31a0 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_31a0 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_31a0 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_31a0 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_31a0 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_31a0 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_32f8 = (code *)0x11bfa1;
  ppfStack_31a0 = ptr_iterator_01;
  gettimeofday(&tStack_32a8,(__timezone_ptr_t)0x0);
  pfStack_32e0 = (fdb_doc *)0x0;
  pcStack_32f8 = (code *)0x11bfaf;
  memleak_start();
  pfVar11 = &fStack_3298;
  pcStack_32f8 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_32f8 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_32f8 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_32f8 = (code *)0x11bfe6;
  fVar3 = fdb_open(&pfStack_32c8,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_32f8 = (code *)0x11c002;
    fVar3 = fdb_kvs_open_default(pfStack_32c8,&pfStack_32d0,&fStack_32c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_32f8 = (code *)0x11c025;
    fdb_set_kv(pfStack_32d0,"a",1,(void *)0x0,0);
    pfVar11 = (fdb_config *)0x154b95;
    pcStack_32f8 = (code *)0x11c043;
    fdb_set_kv(pfStack_32d0,"b",1,(void *)0x0,0);
    pcStack_32f8 = (code *)0x11c05e;
    fdb_set_kv(pfStack_32d0,"c",1,(void *)0x0,0);
    pcStack_32f8 = (code *)0x11c082;
    fVar3 = fdb_iterator_init(pfStack_32d0,&pfStack_32d8,"b",1,(void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_32f8 = (code *)0x11c094;
    fVar3 = fdb_iterator_seek_to_min(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_32f8 = (code *)0x11c0ab;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_32e0->key != 'b') goto LAB_0011c227;
    pcStack_32f8 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11c0dd;
    fVar3 = fdb_iterator_seek_to_max(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_32f8 = (code *)0x11c0f4;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_32e0->key != 'c') goto LAB_0011c23d;
    pcStack_32f8 = (code *)0x11c113;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11c126;
    fVar3 = fdb_iterator_prev(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_32f8 = (code *)0x11c13d;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_32e0->key != 'b') goto LAB_0011c253;
    pcStack_32f8 = (code *)0x11c15c;
    fdb_doc_free(pfStack_32e0);
    pfStack_32e0 = (fdb_doc *)0x0;
    pcStack_32f8 = (code *)0x11c16f;
    fVar3 = fdb_iterator_next(pfStack_32d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_32f8 = (code *)0x11c186;
    fVar3 = fdb_iterator_get(pfStack_32d8,&pfStack_32e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_32e0->key == 'c') {
      pcStack_32f8 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_32e0);
      pfStack_32e0 = (fdb_doc *)0x0;
      pcStack_32f8 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_32d8);
      pcStack_32f8 = (code *)0x11c1c2;
      fdb_close(pfStack_32c8);
      pcStack_32f8 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_32f8 = (code *)0x11c1cc;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_32f8 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar13,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_32f8 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_32f8 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_32f8 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_32f8 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_32f8 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_32f8 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_32f8 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_32f8 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_32f8 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_32f8 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_32f8 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_32f8 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_32f8 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_32f8 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_32f8 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_36a0 = (fdb_config *)0x11c28b;
  pfStack_3308 = pfVar11;
  pcStack_3300 = (char *)apfStack_3158;
  pcStack_32f8 = (code *)uVar9;
  gettimeofday(&tStack_3618,(__timezone_ptr_t)0x0);
  pfStack_36a0 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar11 = &fStack_3500;
  pfStack_36a0 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_3500.buffercache_size = 0;
  pfStack_36a0 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_36a0 = (fdb_config *)0x11c2d2;
  sprintf(acStack_3408,"rm -rf  %s*","./iterator_test");
  pfStack_36a0 = (fdb_config *)0x11c2da;
  system(acStack_3408);
  pfStack_36a0 = (fdb_config *)0x11c2ee;
  fVar3 = fdb_open(&pfStack_3678,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_36a0 = (fdb_config *)0x11c30c;
    fVar3 = fdb_kvs_open(pfStack_3678,&pfStack_3680,(char *)0x0,&fStack_3630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_3640 = 0x34323634353773;
    uStack_3639 = 0xff;
    uStack_3658 = 0x34323634353773;
    uStack_3651 = 0x10000ff;
    uStack_3648._0_4_ = 0x34353773;
    uStack_3648._4_1_ = true;
    uStack_3648._5_1_ = true;
    uStack_3648._6_1_ = '4';
    uStack_3648._7_1_ = 0xff;
    uStack_3668 = 0xff34323634353773;
    uStack_3660 = 0xff;
    uStack_3608 = 0x3179656b;
    uStack_3604 = 0;
    pfStack_36a0 = (fdb_config *)0x11c370;
    fVar3 = fdb_set_kv(pfStack_3680,&uStack_3640,0xb,&uStack_3608,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_3604 = 0;
    uStack_3608 = 0x3279656b;
    pfStack_36a0 = (fdb_config *)0x11c3a4;
    fVar3 = fdb_set_kv(pfStack_3680,&uStack_3658,0xb,&uStack_3608,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_36a0 = (fdb_config *)0x11c3bb;
    fVar3 = fdb_commit(pfStack_3678,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_36a0 = (fdb_config *)0x11c3ee;
    fVar3 = fdb_iterator_init(pfStack_3680,&pfStack_3688,&uStack_3648,8,&uStack_3668,9,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar4 = 0;
    pfVar11 = (fdb_config *)&pfStack_3670;
    do {
      pfStack_3670 = (fdb_doc *)0x0;
      pfStack_36a0 = (fdb_config *)0x11c413;
      fVar3 = fdb_iterator_get(pfStack_3688,(fdb_doc **)pfVar11);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      iVar4 = iVar4 + 1;
      pfStack_36a0 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_3670);
      pfStack_36a0 = (fdb_config *)0x11c42d;
      fVar3 = fdb_iterator_next(pfStack_3688);
    } while (fVar3 == FDB_RESULT_SUCCESS);
    if (iVar4 != 2) goto LAB_0011c4bf;
    pfStack_36a0 = (fdb_config *)0x11c444;
    fVar3 = fdb_iterator_close(pfStack_3688);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_36a0 = (fdb_config *)0x11c452;
    fVar3 = fdb_close(pfStack_3678);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_36a0 = (fdb_config *)0x11c45b;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_36a0 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_36a0 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar13,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_36a0 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_36a0 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_36a0 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_36a0 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_36a0 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_36a0 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_36a0 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_36a0 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_36a0 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_36a0 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_37f8 = (fdb_config *)0x11c4e9;
  pfStack_36a0 = pfVar11;
  gettimeofday(&tStack_37a8,(__timezone_ptr_t)0x0);
  pfStack_37f8 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_37e0 = (fdb_iterator *)0x0;
  pfStack_37d0 = (fdb_doc *)0x0;
  pfVar11 = &fStack_3798;
  pfStack_37f8 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_37f8 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_37f8 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_37f8 = (fdb_config *)0x11c52f;
  fVar3 = fdb_open(&pfStack_37c8,"./iterator_test1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_37f8 = (fdb_config *)0x11c54b;
    fVar3 = fdb_kvs_open_default(pfStack_37c8,&pfStack_37d8,&fStack_37c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_37f8 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_37d8,"A",1,(void *)0x0,0);
    pfVar11 = (fdb_config *)0x154dcc;
    pfStack_37f8 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_37d8,"B",1,(void *)0x0,0);
    pfStack_37f8 = (fdb_config *)0x11c5b7;
    fVar3 = fdb_iterator_init(pfStack_37d8,&pfStack_37e0,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_37f8 = (fdb_config *)0x11c5c9;
    fVar3 = fdb_iterator_seek_to_max(pfStack_37e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_37f8 = (fdb_config *)0x11c5e0;
    fVar3 = fdb_iterator_get(pfStack_37e0,&pfStack_37d0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_37d0->key != 'B') goto LAB_0011c722;
    pfStack_37f8 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_37d0);
    pfStack_37d0 = (fdb_doc *)0x0;
    pfStack_37f8 = (fdb_config *)0x11c612;
    fVar3 = fdb_iterator_close(pfStack_37e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_37e0 = (fdb_iterator *)0x0;
    pfStack_37f8 = (fdb_config *)0x11c639;
    fVar3 = fdb_del_kv(pfStack_37d8,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_37f8 = (fdb_config *)0x11c670;
    fVar3 = fdb_iterator_init(pfStack_37d8,&pfStack_37e0,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_37f8 = (fdb_config *)0x11c687;
    fVar3 = fdb_iterator_get(pfStack_37e0,&pfStack_37d0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_37f8 = (fdb_config *)0x11c69a;
    fVar3 = fdb_iterator_seek_to_max(pfStack_37e0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_37f8 = (fdb_config *)0x11c6ad;
    fVar3 = fdb_close(pfStack_37c8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_37f8 = (fdb_config *)0x11c6ba;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_37f8 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_37f8 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar13,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_37f8 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_37f8 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_37f8 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_37f8 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_37f8 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_37f8 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_37f8 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_37f8 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_37f8 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_37f8 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_37f8 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_37f8 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_37f8 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_37f8 = pfVar11;
  gettimeofday(&tStack_3900,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_3938 = (fdb_iterator *)0x0;
  pfStack_3920 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar3 = fdb_open(&pfStack_3928,"./iterator_test1",&fStack_38f0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_kvs_open_default(pfStack_3928,&pfStack_3930,&fStack_3918);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_3930,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_3930,"C",1,(void *)0x0,0);
    fVar3 = fdb_del_kv(pfStack_3930,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar3 = fdb_iterator_init(pfStack_3930,&pfStack_3938,"A",1,"B",1,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar3 = fdb_iterator_get(pfStack_3938,&pfStack_3920);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar3 = fdb_iterator_seek_to_min(pfStack_3938);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar3 = fdb_iterator_close(pfStack_3938);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar3 = fdb_close(pfStack_3928);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar13,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar4 = 0;
  do {
    iterator_complete_test(iVar4,0);
    iterator_complete_test(iVar4,1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_manual_wal_flush()
{
    TEST_INIT();
    memleak_start();

    int r;
    unsigned char key1[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  45,  0,  6, 49,  0,  0,  0};
    unsigned char key2[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  49, 45,  0,  6, 49, 50,  0,  0,
                                   0};
    unsigned char start_key1[] = { 8,  5, 62, 62, 52, 49, 57, 57,
                                  57, 45,  0};
    unsigned char start_key2[] = { 8,  5, 62, 62, 52, 51, 52, 53,
                                  10, 20,  0};
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    fdb_set_kv(db, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db, key2, sizeof(key2), NULL, 0);

    // normal commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    fdb_set_kv(db2, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db2, key2, sizeof(key2), NULL, 0);

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, NULL, 0,
                               start_key1, sizeof(start_key1), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key1, sizeof(start_key1), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, NULL, 0,
                               start_key2, sizeof(start_key2), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key2, sizeof(start_key2), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    while (fdb_iterator_prev(it) != FDB_RESULT_ITERATOR_FAIL) {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }
    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator manual wal flush");
}